

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O2

void __thiscall
icu_63::DateFormatSymbols::setMonths
          (DateFormatSymbols *this,UnicodeString *monthsArray,int32_t count,DtContextType context,
          DtWidthType width)

{
  UnicodeString *pUVar1;
  UnicodeString *pUVar2;
  UMemory *this_00;
  long lVar3;
  long lStack_50;
  UnicodeString **local_38;
  
  pUVar2 = monthsArray;
  if (context == STANDALONE) {
    if (width == ABBREVIATED) {
      local_38 = &this->fStandaloneShortMonths;
      pUVar1 = this->fStandaloneShortMonths;
      if (pUVar1 == (UnicodeString *)0x0) {
        lStack_50 = 0x80;
        goto LAB_002d03d4;
      }
      this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
      lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
      lStack_50 = 0x80;
      if (lVar3 != 0) {
        lVar3 = lVar3 << 6;
        do {
          icu_63::UnicodeString::~UnicodeString
                    ((UnicodeString *)
                     ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
          lVar3 = lVar3 + -0x40;
        } while (lVar3 != 0);
      }
    }
    else if (width == NARROW) {
      local_38 = &this->fStandaloneNarrowMonths;
      pUVar1 = this->fStandaloneNarrowMonths;
      if (pUVar1 == (UnicodeString *)0x0) {
        lStack_50 = 0x90;
        goto LAB_002d03d4;
      }
      this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
      lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
      lStack_50 = 0x90;
      if (lVar3 != 0) {
        lVar3 = lVar3 << 6;
        do {
          icu_63::UnicodeString::~UnicodeString
                    ((UnicodeString *)
                     ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
          lVar3 = lVar3 + -0x40;
        } while (lVar3 != 0);
      }
    }
    else {
      if (width != WIDE) {
        return;
      }
      local_38 = &this->fStandaloneMonths;
      pUVar1 = this->fStandaloneMonths;
      if (pUVar1 == (UnicodeString *)0x0) {
        lStack_50 = 0x70;
        goto LAB_002d03d4;
      }
      this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
      lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
      lStack_50 = 0x70;
      if (lVar3 != 0) {
        lVar3 = lVar3 << 6;
        do {
          icu_63::UnicodeString::~UnicodeString
                    ((UnicodeString *)
                     ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
          lVar3 = lVar3 + -0x40;
        } while (lVar3 != 0);
      }
    }
  }
  else {
    if (context != FORMAT) {
      return;
    }
    if (width == ABBREVIATED) {
      local_38 = &this->fShortMonths;
      pUVar1 = this->fShortMonths;
      if (pUVar1 == (UnicodeString *)0x0) {
        lStack_50 = 0x50;
        goto LAB_002d03d4;
      }
      this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
      lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
      lStack_50 = 0x50;
      if (lVar3 != 0) {
        lVar3 = lVar3 << 6;
        do {
          icu_63::UnicodeString::~UnicodeString
                    ((UnicodeString *)
                     ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
          lVar3 = lVar3 + -0x40;
        } while (lVar3 != 0);
      }
    }
    else if (width == NARROW) {
      local_38 = &this->fNarrowMonths;
      pUVar1 = this->fNarrowMonths;
      if (pUVar1 == (UnicodeString *)0x0) {
        lStack_50 = 0x60;
        goto LAB_002d03d4;
      }
      this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
      lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
      lStack_50 = 0x60;
      if (lVar3 != 0) {
        lVar3 = lVar3 << 6;
        do {
          icu_63::UnicodeString::~UnicodeString
                    ((UnicodeString *)
                     ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
          lVar3 = lVar3 + -0x40;
        } while (lVar3 != 0);
      }
    }
    else {
      if (width != WIDE) {
        return;
      }
      local_38 = &this->fMonths;
      pUVar1 = this->fMonths;
      if (pUVar1 == (UnicodeString *)0x0) {
        lStack_50 = 0x40;
        goto LAB_002d03d4;
      }
      this_00 = (UMemory *)((long)&pUVar1[-1].fUnion + 0x30);
      lVar3 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
      lStack_50 = 0x40;
      if (lVar3 != 0) {
        lVar3 = lVar3 << 6;
        do {
          icu_63::UnicodeString::~UnicodeString
                    ((UnicodeString *)
                     ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
          lVar3 = lVar3 + -0x40;
        } while (lVar3 != 0);
      }
    }
  }
  UMemory::operator_delete__(this_00,pUVar2);
LAB_002d03d4:
  pUVar2 = newUnicodeStringArray((long)count);
  *local_38 = pUVar2;
  uprv_arrayCopy(monthsArray,pUVar2,count);
  *(int32_t *)((long)&(this->super_UObject)._vptr_UObject + lStack_50) = count;
  return;
}

Assistant:

void
DateFormatSymbols::setMonths(const UnicodeString* monthsArray, int32_t count, DtContextType context, DtWidthType width)
{
    // delete the old list if we own it
    // we always own the new list, which we create here (we duplicate rather
    // than adopting the list passed in)

    switch (context) {
    case FORMAT :
        switch (width) {
        case WIDE :
            if (fMonths)
                delete[] fMonths;
            fMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fMonths,count);
            fMonthsCount = count;
            break;
        case ABBREVIATED :
            if (fShortMonths)
                delete[] fShortMonths;
            fShortMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fShortMonths,count);
            fShortMonthsCount = count;
            break;
        case NARROW :
            if (fNarrowMonths)
                delete[] fNarrowMonths;
            fNarrowMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fNarrowMonths,count);
            fNarrowMonthsCount = count;
            break;
        default :
            break;
        }
        break;
    case STANDALONE :
        switch (width) {
        case WIDE :
            if (fStandaloneMonths)
                delete[] fStandaloneMonths;
            fStandaloneMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fStandaloneMonths,count);
            fStandaloneMonthsCount = count;
            break;
        case ABBREVIATED :
            if (fStandaloneShortMonths)
                delete[] fStandaloneShortMonths;
            fStandaloneShortMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fStandaloneShortMonths,count);
            fStandaloneShortMonthsCount = count;
            break;
        case NARROW :
           if (fStandaloneNarrowMonths)
                delete[] fStandaloneNarrowMonths;
            fStandaloneNarrowMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fStandaloneNarrowMonths,count);
            fStandaloneNarrowMonthsCount = count;
            break;
        default :
            break;
        }
        break;
    case DT_CONTEXT_COUNT :
        break;
    }
}